

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

char * mpack_node_cstr_alloc(mpack_node_t node,size_t maxlen)

{
  uint uVar1;
  char *pcVar2;
  mpack_error_t error;
  _Bool _Var3;
  char *__dest;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar4;
  ulong bytes;
  
  tree = node.tree;
  pmVar4 = node.data;
  if (tree->error != mpack_ok) {
    return (char *)0x0;
  }
  if (maxlen == 0) {
    error = mpack_error_bug;
    goto LAB_00108018;
  }
  if (pmVar4->type == mpack_type_str) {
    uVar1 = pmVar4->len;
    bytes = (ulong)uVar1;
    if (maxlen - 1 < bytes) {
      error = mpack_error_too_big;
      goto LAB_00108018;
    }
    pcVar2 = tree->data;
    pmVar4 = (pmVar4->value).children;
    _Var3 = mpack_str_check_no_null(pcVar2 + (long)pmVar4,bytes);
    if (_Var3) {
      __dest = (char *)malloc((ulong)(uVar1 + 1));
      if (__dest != (char *)0x0) {
        memcpy(__dest,pcVar2 + (long)pmVar4,bytes);
        __dest[bytes] = '\0';
        return __dest;
      }
      error = mpack_error_memory;
      goto LAB_00108018;
    }
  }
  error = mpack_error_type;
LAB_00108018:
  mpack_tree_flag_error(tree,error);
  return (char *)0x0;
}

Assistant:

char* mpack_node_cstr_alloc(mpack_node_t node, size_t maxlen) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    // make sure maxlen makes sense
    if (maxlen < 1) {
        mpack_break("maxlen is zero; you must have room for at least a null-terminator");
        mpack_node_flag_error(node, mpack_error_bug);
        return NULL;
    }

    if (node.data->type != mpack_type_str) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    if (node.data->len > maxlen - 1) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return NULL;
    }

    if (!mpack_str_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    char* ret = (char*) MPACK_MALLOC((size_t)(node.data->len + 1));
    if (ret == NULL) {
        mpack_node_flag_error(node, mpack_error_memory);
        return NULL;
    }

    mpack_memcpy(ret, mpack_node_data_unchecked(node), node.data->len);
    ret[node.data->len] = '\0';
    return ret;
}